

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool Args::details::isFlag(String *word)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RDI;
  String *in_stack_00000010;
  String *in_stack_ffffffffffffffd8;
  QChar local_12 [4];
  char16_t cStack_a;
  
  cStack_a = (char16_t)((ulong)in_RDI >> 0x30);
  bVar1 = isArgument(in_stack_00000010);
  if (!bVar1) {
    QChar::QChar(local_12,'-');
    iVar2 = String::find(in_stack_ffffffffffffffd8,(Char)cStack_a);
    if (iVar2 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool
isFlag( const String & word )
{
	if( !isArgument( word ) )
	{
		if( word.find( SL( '-' ) ) == 0 )
			return true;
	}

	return false;
}